

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Window.cpp
# Opt level: O1

void __thiscall cursespp::Window::Window(Window *this,IWindow *parent)

{
  connections_list *pcVar1;
  int iVar2;
  
  (this->super_enable_shared_from_this<cursespp::IWindow>)._M_weak_this.
  super___weak_ptr<cursespp::IWindow,_(__gnu_cxx::_Lock_policy)2> =
       (__weak_ptr<cursespp::IWindow,_(__gnu_cxx::_Lock_policy)2>)0x0;
  (this->super_IWindow).super_IOrderable._vptr_IOrderable = (_func_int **)&PTR__Window_001ab348;
  (this->super_IWindow).super_IDisplayable._vptr_IDisplayable = (_func_int **)&DAT_001ab518;
  (this->super_IWindow).super_IMouseHandler._vptr_IMouseHandler =
       (_func_int **)&PTR__Window_001ab548;
  (this->super_IWindow).super_IMessageTarget._vptr_IMessageTarget =
       (_func_int **)&PTR__Window_001ab570;
  (this->MouseEvent).
  super__signal_base2<cursespp::Window_*,_const_cursespp::IMouseHandler::Event_*,_sigslot::multi_threaded_local>
  .super__signal_base<sigslot::multi_threaded_local>.super_multi_threaded_local.
  _vptr_multi_threaded_local = (_func_int **)&PTR__multi_threaded_local_001a69e0;
  pthread_mutex_init((pthread_mutex_t *)
                     &(this->MouseEvent).
                      super__signal_base2<cursespp::Window_*,_const_cursespp::IMouseHandler::Event_*,_sigslot::multi_threaded_local>
                      .super__signal_base<sigslot::multi_threaded_local>.super_multi_threaded_local.
                      m_mutex,(pthread_mutexattr_t *)0x0);
  pcVar1 = &(this->MouseEvent).
            super__signal_base2<cursespp::Window_*,_const_cursespp::IMouseHandler::Event_*,_sigslot::multi_threaded_local>
            .m_connected_slots;
  *(connections_list **)
   ((long)&(this->MouseEvent).
           super__signal_base2<cursespp::Window_*,_const_cursespp::IMouseHandler::Event_*,_sigslot::multi_threaded_local>
           .m_connected_slots.
           super__List_base<sigslot::_connection_base2<cursespp::Window_*,_const_cursespp::IMouseHandler::Event_*,_sigslot::multi_threaded_local>_*,_std::allocator<sigslot::_connection_base2<cursespp::Window_*,_const_cursespp::IMouseHandler::Event_*,_sigslot::multi_threaded_local>_*>_>
           ._M_impl._M_node.super__List_node_base + 8) = pcVar1;
  (this->MouseEvent).
  super__signal_base2<cursespp::Window_*,_const_cursespp::IMouseHandler::Event_*,_sigslot::multi_threaded_local>
  .m_connected_slots.
  super__List_base<sigslot::_connection_base2<cursespp::Window_*,_const_cursespp::IMouseHandler::Event_*,_sigslot::multi_threaded_local>_*,_std::allocator<sigslot::_connection_base2<cursespp::Window_*,_const_cursespp::IMouseHandler::Event_*,_sigslot::multi_threaded_local>_*>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)pcVar1;
  (this->MouseEvent).
  super__signal_base2<cursespp::Window_*,_const_cursespp::IMouseHandler::Event_*,_sigslot::multi_threaded_local>
  .m_connected_slots.
  super__List_base<sigslot::_connection_base2<cursespp::Window_*,_const_cursespp::IMouseHandler::Event_*,_sigslot::multi_threaded_local>_*,_std::allocator<sigslot::_connection_base2<cursespp::Window_*,_const_cursespp::IMouseHandler::Event_*,_sigslot::multi_threaded_local>_*>_>
  ._M_impl._M_node._M_size = 0;
  (this->MouseEvent).
  super__signal_base2<cursespp::Window_*,_const_cursespp::IMouseHandler::Event_*,_sigslot::multi_threaded_local>
  .super__signal_base<sigslot::multi_threaded_local>.super_multi_threaded_local.
  _vptr_multi_threaded_local = (_func_int **)&PTR__signal2_001ab8e8;
  *(undefined4 *)&(this->contentColor).value = 0xffffffff;
  *(undefined4 *)((long)&(this->contentColor).value + 4) = 0xffffffff;
  *(undefined4 *)&(this->frameColor).value = 0xffffffff;
  *(undefined4 *)((long)&(this->frameColor).value + 4) = 0xffffffff;
  *(undefined4 *)&(this->focusedContentColor).value = 0xffffffff;
  *(undefined4 *)((long)&(this->focusedContentColor).value + 4) = 0xffffffff;
  *(undefined4 *)&(this->focusedFrameColor).value = 0xffffffff;
  *(undefined4 *)((long)&(this->focusedFrameColor).value + 4) = 0xffffffff;
  (this->title)._M_dataplus._M_p = (pointer)&(this->title).field_2;
  (this->title)._M_string_length = 0;
  (this->title).field_2._M_local_buf[0] = '\0';
  this->lastNotifiedVisible = false;
  this->framePanel = (PANEL *)0x0;
  this->frame = (WINDOW *)0x0;
  this->contentPanel = (PANEL *)0x0;
  this->content = (WINDOW *)0x0;
  this->parent = parent;
  this->width = 0;
  this->height = 0;
  this->x = 0;
  this->y = 0;
  this->lastAbsoluteX = 0;
  this->lastAbsoluteY = 0;
  (this->contentColor).value = 0x700;
  (this->frameColor).value = 0x800;
  (this->focusedContentColor).value = 0x700;
  (this->focusedFrameColor).value = 0x900;
  this->drawFrame = true;
  this->isVisibleInParent = false;
  this->isDirty = true;
  this->focusOrder = -1;
  iVar2 = NEXT_ID + 1;
  this->id = NEXT_ID;
  NEXT_ID = iVar2;
  this->badBounds = false;
  (**(code **)(messageQueue + 0x38))(&messageQueue,&(this->super_IWindow).super_IMessageTarget);
  return;
}

Assistant:

Window::Window(IWindow *parent) {
    this->frame = this->content = 0;
    this->framePanel = this->contentPanel = 0;
    this->parent = parent;
    this->height = 0;
    this->width = 0;
    this->x = 0;
    this->y = 0;
    this->lastAbsoluteX = 0;
    this->lastAbsoluteY = 0;
    this->contentColor = Color(Color::ContentColorDefault);
    this->frameColor = Color(Color::FrameDefault);
    this->focusedContentColor = Color(Color::ContentColorDefault);
    this->focusedFrameColor = Color(Color::FrameFocused);
    this->drawFrame = true;
    this->isVisibleInParent = false;
    this->isDirty = true;
    this->focusOrder = -1;
    this->id = NEXT_ID++;
    this->badBounds = false;
    Window::MessageQueue().Register(this);
}